

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::setTimeBarrier(CoreBroker *this,Time barrierTime)

{
  bool bVar1;
  GlobalBrokerId id;
  BrokerBase *this_00;
  baseType in_RSI;
  long in_RDI;
  ActionMessage tbarrier;
  ActionMessage *in_stack_fffffffffffffef8;
  action_t in_stack_ffffffffffffff1c;
  ActionMessage *in_stack_ffffffffffffff20;
  GlobalFederateId local_d4 [3];
  BaseType local_c8;
  baseType local_b0;
  CoreBroker *in_stack_ffffffffffffffe0;
  TimeRepresentation<count_time<9,_long>_> local_18 [2];
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  local_8.internalTimeCode = in_RSI;
  local_18[0] = TimeRepresentation<count_time<9,_long>_>::maxVal();
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==(&local_8,local_18);
  if (bVar1) {
    clearTimeBarrier(in_stack_ffffffffffffffe0);
  }
  else {
    ActionMessage::ActionMessage(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    this_00 = (BrokerBase *)(in_RDI + 8);
    id = CLI::std::atomic<helics::GlobalBrokerId>::load
                   ((atomic<helics::GlobalBrokerId> *)(in_RDI + 0x10),seq_cst);
    GlobalFederateId::GlobalFederateId(local_d4,id);
    local_c8 = local_d4[0].gid;
    local_b0 = local_8.internalTimeCode;
    BrokerBase::addActionMessage(this_00,in_stack_fffffffffffffef8);
    ActionMessage::~ActionMessage((ActionMessage *)this_00);
  }
  return;
}

Assistant:

void CoreBroker::setTimeBarrier(Time barrierTime)
{
    if (barrierTime == Time::maxVal()) {
        return clearTimeBarrier();
    }
    ActionMessage tbarrier(CMD_TIME_BARRIER_REQUEST);
    tbarrier.source_id = global_id.load();
    tbarrier.actionTime = barrierTime;
    addActionMessage(tbarrier);
}